

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecHsh.h
# Opt level: O1

int Hsh_VecManAdd(Hsh_VecMan_t *p,Vec_Int_t *vVec)

{
  Vec_Int_t *pVVar1;
  Vec_Int_t *pVVar2;
  Vec_Int_t *pVVar3;
  ulong uVar4;
  uint uVar5;
  int iVar6;
  int *piVar7;
  uint *puVar8;
  int iVar9;
  uint uVar10;
  uint uVar11;
  ulong uVar13;
  long lVar14;
  ulong uVar12;
  
  pVVar1 = p->vTable;
  if (pVVar1->nSize < p->vMap->nSize) {
    uVar13 = (ulong)(pVVar1->nSize * 2 - 1);
    while( true ) {
      do {
        uVar10 = (uint)uVar13;
        uVar11 = uVar10 + 1;
        uVar12 = (ulong)uVar11;
        uVar4 = uVar13 & 1;
        uVar13 = uVar12;
      } while (uVar4 != 0);
      if (uVar11 < 9) break;
      iVar9 = 5;
      while (uVar11 % (iVar9 - 2U) != 0) {
        uVar5 = iVar9 * iVar9;
        iVar9 = iVar9 + 2;
        if (uVar11 < uVar5) goto LAB_0072e921;
      }
    }
LAB_0072e921:
    if (pVVar1->nCap < (int)uVar11) {
      if (pVVar1->pArray == (int *)0x0) {
        piVar7 = (int *)malloc((long)(int)uVar11 << 2);
      }
      else {
        piVar7 = (int *)realloc(pVVar1->pArray,(long)(int)uVar11 << 2);
      }
      pVVar1->pArray = piVar7;
      if (piVar7 == (int *)0x0) {
        __assert_fail("p->pArray",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
      }
      pVVar1->nCap = uVar11;
    }
    if (uVar10 < 0x7fffffff) {
      memset(pVVar1->pArray,0xff,uVar12 << 2);
    }
    pVVar1->nSize = uVar11;
    pVVar1 = p->vMap;
    if (0 < pVVar1->nSize) {
      pVVar2 = p->vTable;
      pVVar3 = p->vData;
      lVar14 = 0;
      do {
        iVar9 = pVVar1->pArray[lVar14];
        if (((long)iVar9 < 0) || (pVVar3->nSize <= iVar9)) goto LAB_0072ec0d;
        piVar7 = pVVar3->pArray;
        iVar6 = piVar7[iVar9];
        (p->vTemp).nCap = iVar6;
        (p->vTemp).nSize = iVar6;
        (p->vTemp).pArray = piVar7 + iVar9 + 2;
        if ((long)iVar6 < 1) {
          uVar10 = 0;
        }
        else {
          uVar13 = 0;
          uVar10 = 0;
          do {
            uVar10 = uVar10 + (&Hsh_VecManHash_s_Primes)[uVar13 % 7] * (p->vTemp).pArray[uVar13];
            uVar13 = uVar13 + 1;
          } while ((long)iVar6 != uVar13);
        }
        uVar11 = pVVar2->nSize;
        uVar13 = (ulong)uVar10 % (ulong)uVar11;
        if (((int)uVar13 < 0) || ((int)uVar11 <= (int)uVar13)) goto LAB_0072ec0d;
        if (pVVar1->nSize <= lVar14) goto LAB_0072ec2c;
        iVar9 = pVVar1->pArray[lVar14];
        if (((long)iVar9 < 0) || (pVVar3->nSize <= iVar9)) goto LAB_0072ec0d;
        piVar7 = pVVar2->pArray;
        pVVar3->pArray[(long)iVar9 + 1] = piVar7[uVar13];
        piVar7[uVar13] = (int)lVar14;
        lVar14 = lVar14 + 1;
      } while (lVar14 < pVVar1->nSize);
    }
  }
  uVar10 = p->vTable->nSize;
  iVar9 = vVec->nSize;
  if ((long)iVar9 < 1) {
    uVar11 = 0;
  }
  else {
    uVar13 = 0;
    uVar11 = 0;
    do {
      uVar11 = uVar11 + (&Hsh_VecManHash_s_Primes)[uVar13 % 7] * vVec->pArray[uVar13];
      uVar13 = uVar13 + 1;
    } while ((long)iVar9 != uVar13);
  }
  uVar13 = (ulong)uVar11 % (ulong)uVar10;
  iVar6 = (int)uVar13;
  if ((-1 < iVar6) && (iVar6 < (int)uVar10)) {
    puVar8 = (uint *)(p->vTable->pArray + uVar13);
    do {
      uVar10 = *puVar8;
      if ((ulong)uVar10 == 0xffffffff) {
        piVar7 = (int *)0x0;
      }
      else {
        if (((int)uVar10 < 0) || (p->vMap->nSize <= (int)uVar10)) {
LAB_0072ec2c:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        iVar6 = p->vMap->pArray[uVar10];
        if (((long)iVar6 < 0) || (p->vData->nSize <= iVar6)) break;
        piVar7 = p->vData->pArray + iVar6;
      }
      if (piVar7 == (int *)0x0) {
        pVVar1 = p->vMap;
        *puVar8 = pVVar1->nSize;
        uVar10 = p->vData->nSize;
        if ((uVar10 & 1) == 0) {
          Vec_IntPush(pVVar1,uVar10);
          Vec_IntPush(p->vData,vVec->nSize);
          Vec_IntPush(p->vData,-1);
          uVar13 = (ulong)(uint)vVec->nSize;
          if (0 < vVec->nSize) {
            lVar14 = 0;
            do {
              Vec_IntPush(p->vData,vVec->pArray[lVar14]);
              lVar14 = lVar14 + 1;
              uVar13 = (ulong)vVec->nSize;
            } while (lVar14 < (long)uVar13);
          }
          if ((uVar13 & 1) != 0) {
            Vec_IntPush(p->vData,-1);
          }
          return p->vMap->nSize + -1;
        }
        __assert_fail("Vec_IntSize(p->vData) % 2 == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecHsh.h"
                      ,0x216,"int Hsh_VecManAdd(Hsh_VecMan_t *, Vec_Int_t *)");
      }
      if ((*piVar7 == iVar9) &&
         (iVar6 = bcmp(piVar7 + 2,vVec->pArray,(long)*piVar7 << 2), iVar6 == 0)) {
        return uVar10;
      }
      puVar8 = (uint *)(piVar7 + 1);
    } while( true );
  }
LAB_0072ec0d:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                ,0x1ba,"int *Vec_IntEntryP(Vec_Int_t *, int)");
}

Assistant:

static inline int Hsh_VecManAdd( Hsh_VecMan_t * p, Vec_Int_t * vVec )
{
    Hsh_VecObj_t * pObj;
    int i, Ent, * pPlace;
    if ( Vec_IntSize(p->vMap) > Vec_IntSize(p->vTable) )
    {
        Vec_IntFill( p->vTable, Abc_PrimeCudd(2*Vec_IntSize(p->vTable)), -1 );
        for ( i = 0; i < Vec_IntSize(p->vMap); i++ )
        {
            pPlace = Vec_IntEntryP( p->vTable, Hsh_VecManHash(Hsh_VecReadEntry(p, i), Vec_IntSize(p->vTable)) );
            Hsh_VecObj(p, i)->iNext = *pPlace; *pPlace = i;
        }
    }
    pPlace = Vec_IntEntryP( p->vTable, Hsh_VecManHash(vVec, Vec_IntSize(p->vTable)) );
    for ( ; (pObj = Hsh_VecObj(p, *pPlace)); pPlace = &pObj->iNext )
        if ( pObj->nSize == Vec_IntSize(vVec) && !memcmp( pObj->pArray, Vec_IntArray(vVec), sizeof(int) * (size_t)pObj->nSize ) )
            return *pPlace;
    *pPlace = Vec_IntSize(p->vMap);
    assert( Vec_IntSize(p->vData) % 2 == 0 );
    Vec_IntPush( p->vMap, Vec_IntSize(p->vData) );
    Vec_IntPush( p->vData, Vec_IntSize(vVec) );
    Vec_IntPush( p->vData, -1 );
    Vec_IntForEachEntry( vVec, Ent, i )
        Vec_IntPush( p->vData, Ent );
    if ( Vec_IntSize(vVec) & 1 )
        Vec_IntPush( p->vData, -1 );
    return Vec_IntSize(p->vMap) - 1;
}